

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool testing::internal::MatchPrintAndExplain<bool_const,bool_const&>
               (bool *value,Matcher<const_bool_&> *matcher,MatchResultListener *listener)

{
  bool bVar1;
  ostream *poVar2;
  MatchResultListener *in_RDX;
  string *type_name;
  bool match;
  StringMatchResultListener inner_listener;
  StringMatchResultListener *in_stack_fffffffffffffdb8;
  StringMatchResultListener *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  bool *in_stack_fffffffffffffde8;
  MatcherBase<const_bool_&> *in_stack_fffffffffffffdf0;
  string local_1f8 [32];
  string *local_1d8;
  byte local_1b9;
  MatchResultListener *local_20;
  byte local_1;
  
  local_20 = in_RDX;
  bVar1 = MatchResultListener::IsInterested(in_RDX);
  if (bVar1) {
    StringMatchResultListener::StringMatchResultListener
              ((StringMatchResultListener *)
               CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    local_1b9 = MatcherBase<const_bool_&>::MatchAndExplain
                          (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                           (MatchResultListener *)
                           CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0));
    MatchResultListener::stream(local_20);
    UniversalPrint<bool>((bool *)in_stack_fffffffffffffdc0,(ostream *)in_stack_fffffffffffffdb8);
    GetTypeName<bool_const>();
    local_1d8 = local_1f8;
    bVar1 = IsReadableTypeName((string *)in_stack_fffffffffffffdc0);
    if (bVar1) {
      poVar2 = MatchResultListener::stream(local_20);
      poVar2 = std::operator<<(poVar2," (of type ");
      in_stack_fffffffffffffdc0 = (StringMatchResultListener *)std::operator<<(poVar2,local_1d8);
      std::operator<<((ostream *)in_stack_fffffffffffffdc0,")");
    }
    StringMatchResultListener::str_abi_cxx11_(in_stack_fffffffffffffdb8);
    MatchResultListener::stream(local_20);
    PrintIfNotEmpty((string *)in_stack_fffffffffffffdc0,(ostream *)in_stack_fffffffffffffdb8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
    local_1 = local_1b9 & 1;
    std::__cxx11::string::~string(local_1f8);
    StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffdc0);
  }
  else {
    local_1 = MatcherBase<const_bool_&>::Matches
                        (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool MatchPrintAndExplain(Value& value, const Matcher<T>& matcher,
                          MatchResultListener* listener) {
  if (!listener->IsInterested()) {
    // If the listener is not interested, we do not need to construct the
    // inner explanation.
    return matcher.Matches(value);
  }

  StringMatchResultListener inner_listener;
  const bool match = matcher.MatchAndExplain(value, &inner_listener);

  UniversalPrint(value, listener->stream());
#if GTEST_HAS_RTTI
  const std::string& type_name = GetTypeName<Value>();
  if (IsReadableTypeName(type_name))
    *listener->stream() << " (of type " << type_name << ")";
#endif
  PrintIfNotEmpty(inner_listener.str(), listener->stream());

  return match;
}